

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::(anonymous_namespace)::DynamicMessageTest_PackedFields_Test::
~DynamicMessageTest_PackedFields_Test(DynamicMessageTest_PackedFields_Test *this)

{
  protobuf::anon_unknown_0::DynamicMessageTest_PackedFields_Test::
  ~DynamicMessageTest_PackedFields_Test((DynamicMessageTest_PackedFields_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(DynamicMessageTest, PackedFields) {
  // Check that packed fields work properly.
  Arena arena;
  Message* message = packed_prototype_->New(use_arena() ? &arena : nullptr);
  TestUtil::ReflectionTester reflection_tester(packed_descriptor_);

  reflection_tester.SetPackedFieldsViaReflection(message);
  reflection_tester.ExpectPackedFieldsSetViaReflection(*message);

  if (!use_arena()) {
    delete message;
  }
}